

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O3

int Ivy_FraigRefineClasses(Ivy_FraigMan_t *p)

{
  Ivy_Obj_t *pIVar1;
  Ivy_Obj_t *pClass;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  timespec ts;
  timespec local_30;
  
  if (p->pParams->fProve != 0) {
    Ivy_FraigCheckOutputSims(p);
  }
  iVar2 = 0;
  if (p->pManFraig->pData == (void *)0x0) {
    iVar2 = clock_gettime(3,&local_30);
    if (iVar2 < 0) {
      lVar4 = 1;
    }
    else {
      lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_30.tv_nsec),8);
      lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_30.tv_sec * -1000000;
    }
    iVar2 = 0;
    pIVar1 = (p->lClasses).pHead;
    while (pClass = pIVar1, pClass != (Ivy_Obj_t *)0x0) {
      pIVar1 = pClass->pPrevFan0;
      if ((pClass->field_0x8 & 0x10) == 0) {
        iVar3 = Ivy_FraigRefineClass_rec(p,pClass);
        iVar2 = iVar2 + (uint)(0 < iVar3);
      }
    }
    iVar3 = clock_gettime(3,&local_30);
    if (iVar3 < 0) {
      lVar5 = -1;
    }
    else {
      lVar5 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
    }
    p->timeRef = p->timeRef + lVar5 + lVar4;
  }
  return iVar2;
}

Assistant:

int Ivy_FraigRefineClasses( Ivy_FraigMan_t * p )
{
    Ivy_Obj_t * pClass, * pClass2;
    int RetValue, Counter = 0;
    abctime clk;
    // check if some outputs already became non-constant
    // this is a special case when computation can be stopped!!!
    if ( p->pParams->fProve )
        Ivy_FraigCheckOutputSims( p );
    if ( p->pManFraig->pData )
        return 0;
    // refine the classed
clk = Abc_Clock();
    Ivy_FraigForEachEquivClassSafe( p->lClasses.pHead, pClass, pClass2 )
    {
        if ( pClass->fMarkA )
            continue;
        RetValue = Ivy_FraigRefineClass_rec( p, pClass );
        Counter += ( RetValue > 0 );
//if ( Ivy_ObjIsConst1(pClass) )
//printf( "%d ", RetValue );
//if ( Ivy_ObjIsConst1(pClass) )
//    p->time1 += Abc_Clock() - clk;
    }
p->timeRef += Abc_Clock() - clk;
    return Counter;
}